

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

Snapshot * __thiscall
cmState::CreateMacroCallSnapshot
          (Snapshot *__return_storage_ptr__,cmState *this,Snapshot originSnapshot,
          string *entryPointCommand,long entryPointLine,string *fileName)

{
  PositionType PVar1;
  PositionType it;
  bool bVar2;
  ReferenceType pSVar3;
  PointerType pSVar4;
  PointerType pBVar5;
  PointerType pSVar6;
  iterator iVar7;
  PositionType pos;
  iterator local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_118 [232];
  
  it = originSnapshot.Position;
  pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator*(&originSnapshot.Position);
  SnapshotDataType::SnapshotDataType((SnapshotDataType *)local_118,pSVar3);
  local_148 = cmLinkedTree<cmState::SnapshotDataType>::Push
                        (&this->SnapshotData,it,(SnapshotDataType *)local_118);
  std::__cxx11::string::~string((string *)(local_118 + 0xa8));
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_148);
  pSVar4->EntryPointLine = entryPointLine;
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_148);
  std::__cxx11::string::_M_assign((string *)&pSVar4->EntryPointCommand);
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_148);
  pSVar4->SnapshotType = MacroCallType;
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_148);
  pSVar4->Keep = false;
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&originSnapshot.Position);
  iVar7 = pSVar4->ExecutionListFile;
  std::__cxx11::string::string((string *)&local_138,(string *)fileName);
  iVar7 = cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Push(&this->ExecutionListFiles,iVar7,&local_138);
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_148);
  pSVar4->ExecutionListFile = iVar7;
  std::__cxx11::string::~string((string *)&local_138);
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&originSnapshot.Position);
  bVar2 = cmLinkedTree<cmDefinitions>::iterator::IsValid(&pSVar4->Vars);
  if (bVar2) {
    pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_148);
    pBVar5 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar4->BuildSystemDirectory);
    (pBVar5->DirectoryEnd).Tree = local_148.Tree;
    (pBVar5->DirectoryEnd).Position = local_148.Position;
    pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&originSnapshot.Position)
    ;
    pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_148);
    PVar1 = (pSVar4->Policies).Position;
    (pSVar6->PolicyScope).Tree = (pSVar4->Policies).Tree;
    (pSVar6->PolicyScope).Position = PVar1;
    __return_storage_ptr__->State = this;
    (__return_storage_ptr__->Position).Tree = local_148.Tree;
    (__return_storage_ptr__->Position).Position = local_148.Position;
    return __return_storage_ptr__;
  }
  __assert_fail("originSnapshot.Position->Vars.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmState.cxx"
                ,0x39f,
                "cmState::Snapshot cmState::CreateMacroCallSnapshot(cmState::Snapshot, const std::string &, long, const std::string &)"
               );
}

Assistant:

cmState::Snapshot
cmState::CreateMacroCallSnapshot(cmState::Snapshot originSnapshot,
                                    std::string const& entryPointCommand,
                                    long entryPointLine,
                                    std::string const& fileName)
{
  PositionType pos = this->SnapshotData.Push(originSnapshot.Position,
                                             *originSnapshot.Position);
  pos->EntryPointLine = entryPointLine;
  pos->EntryPointCommand = entryPointCommand;
  pos->SnapshotType = MacroCallType;
  pos->Keep = false;
  pos->ExecutionListFile = this->ExecutionListFiles.Push(
        originSnapshot.Position->ExecutionListFile, fileName);
  assert(originSnapshot.Position->Vars.IsValid());
  pos->BuildSystemDirectory->DirectoryEnd = pos;
  pos->PolicyScope = originSnapshot.Position->Policies;
  return cmState::Snapshot(this, pos);
}